

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complextype.cpp
# Opt level: O3

ResultValue * __thiscall
ComplexType::toResultValue
          (ResultValue *__return_storage_ptr__,ComplexType *this,NumericConstant *numericConstant)

{
  NumericConstantChar numChar;
  uint uVar1;
  long *plVar2;
  long *plVar3;
  int iVar4;
  NumericChars *pNVar5;
  uint *puVar6;
  undefined8 uVar7;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  bool bVar8;
  uint uVar9;
  size_t i;
  ulong uVar10;
  long **__endptr;
  bool bVar11;
  char *__end;
  double dVar12;
  Complex value;
  string realPart;
  string imaginaryPart;
  long *local_80;
  long *local_78;
  char *local_70;
  long local_68 [2];
  long *local_58 [2];
  long local_48 [2];
  double local_38;
  
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"","");
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"","");
  bVar11 = true;
  bVar8 = false;
  for (uVar10 = 0; pNVar5 = NumericConstant::chars(numericConstant), plVar2 = local_78,
      uVar10 < (ulong)((long)(pNVar5->
                             super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(pNVar5->
                            super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>
                            )._M_impl.super__Vector_impl_data._M_start); uVar10 = uVar10 + 1) {
    pNVar5 = NumericConstant::chars(numericConstant);
    numChar = (pNVar5->super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>
              )._M_impl.super__Vector_impl_data._M_start[uVar10];
    if (numChar < A) {
LAB_0013721f:
      NumericConstantChars::getChar(numChar);
      std::__cxx11::string::push_back((char)(string *)&local_78);
    }
    else if (numChar - 0x10 < 2) {
      if (uVar10 == 0) goto LAB_0013721f;
      std::__cxx11::string::_M_assign((string *)&local_78);
LAB_0013728e:
      bVar11 = false;
    }
    else {
      if (numChar == DecimalPoint) goto LAB_0013721f;
      if (numChar == ImaginaryUnit) {
        if (!bVar11) {
          bVar8 = true;
          goto LAB_0013728e;
        }
        std::__cxx11::string::_M_assign((string *)local_58);
        bVar11 = true;
        std::__cxx11::string::_M_replace((ulong)&local_78,0,local_70,0x139a07);
        bVar8 = true;
      }
    }
  }
  if (bVar8) {
    iVar4 = std::__cxx11::string::compare((char *)&local_78);
    plVar2 = local_78;
    if (iVar4 == 0) {
      __endptr = (long **)0x139a07;
      iVar4 = std::__cxx11::string::compare((char *)local_58);
      plVar2 = local_58[0];
      uVar7 = extraout_RDX_00;
      if (iVar4 == 0) {
LAB_00137438:
        value._M_value._8_8_ = uVar7;
        value._M_value._0_8_ = __endptr;
        ResultValue::ResultValue(__return_storage_ptr__,value);
        if (local_58[0] != local_48) {
          operator_delete(local_58[0],local_48[0] + 1);
        }
        if (local_78 != local_68) {
          operator_delete(local_78,local_68[0] + 1);
        }
        return __return_storage_ptr__;
      }
      puVar6 = (uint *)__errno_location();
      uVar9 = *puVar6;
      *puVar6 = 0;
      __endptr = &local_80;
      strtod((char *)plVar2,(char **)__endptr);
      if (local_80 != plVar2) {
        uVar7 = extraout_RDX_01;
        if (*puVar6 == 0) {
          *puVar6 = uVar9;
        }
        else if (*puVar6 == 0x22) {
          std::__throw_out_of_range("stod");
        }
        goto LAB_00137438;
      }
      goto LAB_001374ae;
    }
    puVar6 = (uint *)__errno_location();
    uVar9 = *puVar6;
    *puVar6 = 0;
    dVar12 = strtod((char *)plVar2,(char **)&local_80);
    plVar3 = local_58[0];
    if (local_80 == plVar2) goto LAB_00137496;
    uVar1 = *puVar6;
    local_38 = dVar12;
    if (uVar1 == 0) {
      *puVar6 = uVar9;
    }
    else {
      uVar9 = uVar1;
      if (uVar1 == 0x22) {
        std::__throw_out_of_range("stod");
      }
    }
    *puVar6 = 0;
    __endptr = &local_80;
    strtod((char *)local_58[0],(char **)__endptr);
    if (local_80 != plVar3) {
      uVar7 = extraout_RDX_02;
      if (*puVar6 == 0) {
        *puVar6 = uVar9;
      }
      else if (*puVar6 == 0x22) {
        std::__throw_out_of_range("stod");
      }
      goto LAB_00137438;
    }
  }
  else {
    puVar6 = (uint *)__errno_location();
    uVar9 = *puVar6;
    uVar10 = (ulong)uVar9;
    *puVar6 = 0;
    __endptr = &local_80;
    strtod((char *)plVar2,(char **)__endptr);
    if (local_80 != plVar2) {
      uVar7 = extraout_RDX;
      if (*puVar6 == 0) {
        *puVar6 = uVar9;
      }
      else if (*puVar6 == 0x22) {
        std::__throw_out_of_range("stod");
      }
      goto LAB_00137438;
    }
    std::__throw_invalid_argument("stod");
LAB_00137496:
    uVar9 = (uint)uVar10;
    std::__throw_invalid_argument("stod");
  }
  std::__throw_invalid_argument("stod");
LAB_001374ae:
  uVar7 = std::__throw_invalid_argument("stod");
  if (*puVar6 == 0) {
    *puVar6 = uVar9;
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  _Unwind_Resume(uVar7);
}

Assistant:

ResultValue ComplexType::toResultValue(const NumericConstant& numericConstant) const {
	std::string realPart = "";
	std::string imaginaryPart = "";
	std::string& currentPart = realPart;
	bool atRealPart = true;
	bool isComplex = false;

	for (std::size_t i = 0; i < numericConstant.chars().size(); i++) {
		auto c = numericConstant.chars()[i];

		switch (c) {
			case NumericConstantChar::Zero:
			case NumericConstantChar::One:
			case NumericConstantChar::Two:
			case NumericConstantChar::Three:
			case NumericConstantChar::Four:
			case NumericConstantChar::Five:
			case NumericConstantChar::Six:
			case NumericConstantChar::Seven:
			case NumericConstantChar::Eight:
			case NumericConstantChar::Nine:
			case NumericConstantChar::DecimalPoint:
				currentPart += NumericConstantChars::getChar(c);
				break;
			case NumericConstantChar::MinusSign:
			case NumericConstantChar::PlusSign:
				if (i > 0) {
					currentPart = imaginaryPart;
					atRealPart = false;
				} else {
					currentPart += NumericConstantChars::getChar(c);
				}
				break;
			case NumericConstantChar::ImaginaryUnit:
				if (atRealPart) {
					imaginaryPart = realPart;
					realPart = "";
				}

				isComplex = true;
				break;
			default:
				break;
		}
	}

	if (isComplex) {
		if (realPart != "") {
			return Complex(std::stod(realPart), std::stod(imaginaryPart));
		} else if (imaginaryPart != "") {
			return Complex(0.0, std::stod(imaginaryPart));
		} else {
			return Complex(0.0, 1.0);
		}
	} else {
		return Complex(std::stod(realPart), 0.0);
	}
}